

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O1

void R_DrawFogBoundary(int x1,int x2,short *uclip,short *dclip)

{
  lighttable_t *plVar1;
  bool bVar2;
  double dVar3;
  BYTE *pBVar4;
  lighttable_t *plVar5;
  int iVar6;
  SWORD *b2_1;
  long lVar7;
  int iVar8;
  short sVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  uint i;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint y2;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  double dVar20;
  long local_68;
  
  dVar20 = (double)((float)(~x1 + x2) * rw_lightstep + rw_light);
  iVar8 = x2 + -1;
  lVar10 = (long)x2;
  uVar15 = (uint)uclip[lVar10 + -1];
  y2 = (uint)dclip[lVar10 + -1];
  dVar3 = 24.0;
  if (dVar20 <= 24.0) {
    dVar3 = dVar20;
  }
  iVar6 = wallshade - SUB84(dVar3 + 103079215104.0,0) >> 0x10;
  iVar19 = 0x1f;
  if (iVar6 < 0x1f) {
    iVar19 = iVar6;
  }
  iVar6 = 0;
  if (0 < iVar19) {
    iVar6 = iVar19;
  }
  plVar1 = basecolormap->Maps;
  if (uclip[lVar10 + -1] < dclip[lVar10 + -1]) {
    uVar13 = 0;
    do {
      spanend[(long)(int)uVar15 + uVar13] = (short)iVar8;
      uVar13 = uVar13 + 1;
    } while (y2 - uVar15 != uVar13);
  }
  dc_colormap = plVar1 + (uint)(iVar6 << 8);
  if (x1 <= (int)(lVar10 + -2)) {
    local_68 = 0;
    lVar11 = lVar10 + -2;
    do {
      uVar17 = (ulong)y2;
      uVar13 = (ulong)uVar15;
      uVar12 = (uint)uclip[lVar11];
      uVar18 = (uint)dclip[lVar11];
      dVar20 = dVar20 - (double)rw_lightstep;
      dVar3 = dVar20;
      if (24.0 <= dVar20) {
        dVar3 = 24.0;
      }
      iVar19 = wallshade - SUB84(dVar3 + 103079215104.0,0) >> 0x10;
      if (0x1e < iVar19) {
        iVar19 = 0x1f;
      }
      if (iVar19 < 1) {
        iVar19 = 0;
      }
      sVar9 = (short)lVar11;
      if (iVar19 == iVar6) {
        uVar16 = y2;
        if ((int)uVar12 < (int)y2) {
          uVar16 = uVar12;
        }
        if (dc_colormap == plVar1) {
          if ((int)uVar16 < (int)uVar15) {
            uVar16 = uVar15;
          }
          uVar15 = uVar16;
          if ((int)uVar16 < (int)uVar18) {
            uVar15 = uVar18;
          }
          if ((int)uVar15 <= (int)y2) {
            uVar17 = (ulong)uVar15;
          }
        }
        else {
          if ((int)uVar15 < (int)uVar16) {
            uVar13 = (ulong)(int)uVar15;
            do {
              plVar5 = dc_colormap;
              pBVar4 = dc_destorg;
              iVar19 = (int)spanend[uVar13];
              if (spanend[uVar13] < iVar8) {
                iVar19 = iVar8;
              }
              lVar7 = (long)ylookup[uVar13] + lVar10 + -1;
              lVar14 = local_68;
              do {
                pBVar4[lVar14 + lVar7] = plVar5[pBVar4[lVar14 + lVar7]];
                lVar14 = lVar14 + 1;
              } while (iVar19 + (2 - x2) != (int)lVar14);
              uVar13 = uVar13 + 1;
            } while (uVar13 != (long)(int)uVar16);
          }
          uVar16 = (uint)uVar13;
          uVar15 = uVar16;
          if ((int)uVar16 < (int)uVar18) {
            uVar15 = uVar18;
          }
          if ((int)uVar15 < (int)y2) {
            uVar17 = (ulong)(int)y2;
            do {
              plVar5 = dc_colormap;
              pBVar4 = dc_destorg;
              lVar14 = uVar17 + 0x167f;
              lVar7 = uVar17 * 4;
              uVar17 = uVar17 - 1;
              iVar19 = (int)ceilingclip[lVar14];
              if (ceilingclip[lVar14] < iVar8) {
                iVar19 = iVar8;
              }
              lVar7 = (long)*(int *)(&DAT_0088977c + lVar7) + lVar10 + -1;
              lVar14 = local_68;
              do {
                pBVar4[lVar14 + lVar7] = plVar5[pBVar4[lVar14 + lVar7]];
                lVar14 = lVar14 + 1;
              } while (iVar19 + (2 - x2) != (int)lVar14);
            } while ((long)(int)uVar15 < (long)uVar17);
          }
        }
        uVar15 = uVar18;
        if ((int)uVar16 < (int)uVar18) {
          uVar15 = uVar16;
        }
        if ((int)uVar12 < (int)uVar15) {
          lVar7 = (long)(int)uVar12;
          do {
            spanend[lVar7] = sVar9;
            lVar7 = lVar7 + 1;
          } while ((int)uVar15 != lVar7);
        }
        if ((int)uVar16 < (int)(uint)uVar17) {
          uVar16 = (uint)uVar17;
        }
        if ((int)uVar16 < (int)uVar18) {
          lVar7 = (long)(int)uVar18;
          do {
            ceilingclip[lVar7 + 0x167f] = sVar9;
            lVar7 = lVar7 + -1;
          } while ((int)uVar16 < lVar7);
        }
      }
      else {
        if (((int)uVar15 < (int)y2) && (iVar6 != 0)) {
          R_DrawFogBoundarySection(uVar15,y2,(int)lVar11 + 1);
        }
        if ((int)uVar15 < (int)uVar12) {
          uVar12 = uVar15;
        }
        if ((int)uVar18 < (int)y2) {
          uVar18 = y2;
        }
        if (uVar18 - uVar12 != 0 && (int)uVar12 <= (int)uVar18) {
          uVar13 = 0;
          do {
            spanend[(long)(int)uVar12 + uVar13] = sVar9;
            uVar13 = uVar13 + 1;
          } while (uVar18 - uVar12 != uVar13);
        }
        dc_colormap = plVar1 + (uint)(iVar19 << 8);
        iVar6 = iVar19;
      }
      uVar15 = (uint)uclip[lVar11];
      y2 = (uint)dclip[lVar11];
      iVar8 = iVar8 + -1;
      local_68 = local_68 + -1;
      bVar2 = x1 < lVar11;
      lVar11 = lVar11 + -1;
    } while (bVar2);
  }
  if (((int)uVar15 < (int)y2) && (iVar6 != 0)) {
    R_DrawFogBoundarySection(uVar15,y2,x1);
    return;
  }
  return;
}

Assistant:

void R_DrawFogBoundary (int x1, int x2, short *uclip, short *dclip)
{
	// This is essentially the same as R_MapVisPlane but with an extra step
	// to create new horizontal spans whenever the light changes enough that
	// we need to use a new colormap.

	double lightstep = rw_lightstep;
	double light = rw_light + rw_lightstep*(x2-x1-1);
	int x = x2-1;
	int t2 = uclip[x];
	int b2 = dclip[x];
	int rcolormap = GETPALOOKUP(light, wallshade);
	int lcolormap;
	BYTE *basecolormapdata = basecolormap->Maps;

	if (b2 > t2)
	{
		clearbufshort (spanend+t2, b2-t2, x);
	}

	dc_colormap = basecolormapdata + (rcolormap << COLORMAPSHIFT);

	for (--x; x >= x1; --x)
	{
		int t1 = uclip[x];
		int b1 = dclip[x];
		const int xr = x+1;
		int stop;

		light -= rw_lightstep;
		lcolormap = GETPALOOKUP(light, wallshade);
		if (lcolormap != rcolormap)
		{
			if (t2 < b2 && rcolormap != 0)
			{ // Colormap 0 is always the identity map, so rendering it is
			  // just a waste of time.
				R_DrawFogBoundarySection (t2, b2, xr);
			}
			if (t1 < t2) t2 = t1;
			if (b1 > b2) b2 = b1;
			if (t2 < b2)
			{
				clearbufshort (spanend+t2, b2-t2, x);
			}
			rcolormap = lcolormap;
			dc_colormap = basecolormapdata + (lcolormap << COLORMAPSHIFT);
		}
		else
		{
			if (dc_colormap != basecolormapdata)
			{
				stop = MIN (t1, b2);
				while (t2 < stop)
				{
					R_DrawFogBoundaryLine (t2++, xr);
				}
				stop = MAX (b1, t2);
				while (b2 > stop)
				{
					R_DrawFogBoundaryLine (--b2, xr);
				}
			}
			else
			{
				t2 = MAX (t2, MIN (t1, b2));
				b2 = MIN (b2, MAX (b1, t2));
			}

			stop = MIN (t2, b1);
			while (t1 < stop)
			{
				spanend[t1++] = x;
			}
			stop = MAX (b2, t2);
			while (b1 > stop)
			{
				spanend[--b1] = x;
			}
		}

		t2 = uclip[x];
		b2 = dclip[x];
	}
	if (t2 < b2 && rcolormap != 0)
	{
		R_DrawFogBoundarySection (t2, b2, x1);
	}
}